

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

void check_integral_opt<long,zmq::sockopt::integral_option<22,long,false>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               char param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  long val;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage18;
  ScopedMessage scopedMessage17;
  undefined8 local_168;
  MessageBuilder local_160;
  undefined1 local_108 [8];
  undefined8 local_100;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [80];
  SourceLineInfo local_88;
  ScopedMessage local_78;
  
  local_168 = 1;
  local_108 = (undefined1  [8])0x19e995;
  local_100 = 0xe5;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder(&local_160,macroName,(SourceLineInfo *)local_108,Info);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "setting ",param_2);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_160.super_MessageStream.m_stream.m_oss,(char *)local_d8._0_8_,local_d8._8_8_);
  Catch::ScopedMessage::ScopedMessage(&local_78,&local_160);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  paVar1 = &local_160.m_info.message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.m_info.message._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.m_info.message._M_dataplus._M_p,
                    local_160.m_info.message.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_160);
  zmq::detail::socket_base::set_option(param_1,0x16,&local_168,8);
  if (param_3 == '\0') {
    local_88.file =
         "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp";
    local_88.line = 0xea;
    macroName_00.m_size = 4;
    macroName_00.m_start = "INFO";
    Catch::MessageBuilder::MessageBuilder(&local_160,macroName_00,&local_88,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "getting ",param_2);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_160.super_MessageStream.m_stream.m_oss,(char *)local_108,local_100);
    Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_d8,&local_160);
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108,local_f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.m_info.message._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.m_info.message._M_dataplus._M_p,
                      local_160.m_info.message.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_160);
    sVar2 = zmq::detail::socket_base::get<22,long,false>(param_1);
    local_108 = (undefined1  [8])0x19e995;
    local_100 = 0xec;
    macroName_01.m_size = 5;
    macroName_01.m_start = "CHECK";
    capturedExpression.m_size = 8;
    capturedExpression.m_start = "s == val";
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_160,macroName_01,(SourceLineInfo *)local_108,
               capturedExpression,ContinueOnFailure);
    local_100._0_2_ = CONCAT11(sVar2 == 1,true);
    local_108 = (undefined1  [8])&PTR_streamReconstructedExpression_001dda70;
    local_f8._8_8_ = "==";
    local_e8 = 2;
    local_e0 = 1;
    local_f8._0_8_ = sVar2;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_160,(ITransientExpression *)local_108);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_160);
    if (local_160.m_info.message.field_2._M_local_buf[0xb] == '\0') {
      (**(code **)(*(long *)local_160.m_info.lineInfo.file + 0xa0))();
    }
    Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_d8);
  }
  Catch::ScopedMessage::~ScopedMessage(&local_78);
  return;
}

Assistant:

void check_integral_opt(Opt opt,
                        zmq::socket_t &sock,
                        std::string info,
                        bool set_only = false)
{
    const T val = 1;
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}